

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::GetCoefficientFromRecurrentTerm
          (ScalarEvolutionAnalysis *this,SENode *node,Loop *loop)

{
  bool bVar1;
  int iVar2;
  NodePtr pSVar3;
  undefined4 extraout_var;
  Loop *pLVar4;
  SERecurrentNode *rec;
  dag_iterator local_d8;
  undefined1 local_80 [8];
  dag_iterator itr;
  Loop *loop_local;
  SENode *node_local;
  ScalarEvolutionAnalysis *this_local;
  SERecurrentNode *this_00;
  
  itr.parent_iterators_.c.
  super__Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)loop;
  SENode::graph_begin((dag_iterator *)local_80,node);
  do {
    SENode::graph_end(&local_d8,node);
    bVar1 = TreeDFIterator<spvtools::opt::SENode>::operator!=
                      ((TreeDFIterator<spvtools::opt::SENode> *)local_80,&local_d8);
    TreeDFIterator<spvtools::opt::SENode>::~TreeDFIterator(&local_d8);
    if (!bVar1) {
      rec._4_4_ = 2;
LAB_00a29c28:
      TreeDFIterator<spvtools::opt::SENode>::~TreeDFIterator
                ((TreeDFIterator<spvtools::opt::SENode> *)local_80);
      if (rec._4_4_ != 1) {
        this_local = (ScalarEvolutionAnalysis *)CreateConstant(this,0);
      }
      return (SENode *)this_local;
    }
    pSVar3 = TreeDFIterator<spvtools::opt::SENode>::operator->
                       ((TreeDFIterator<spvtools::opt::SENode> *)local_80);
    iVar2 = (*pSVar3->_vptr_SENode[6])();
    this_00 = (SERecurrentNode *)CONCAT44(extraout_var,iVar2);
    if (this_00 != (SERecurrentNode *)0x0) {
      pLVar4 = SERecurrentNode::GetLoop(this_00);
      if (pLVar4 == (Loop *)itr.parent_iterators_.c.
                            super__Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node) {
        this_local = (ScalarEvolutionAnalysis *)SERecurrentNode::GetCoefficient(this_00);
        rec._4_4_ = 1;
        goto LAB_00a29c28;
      }
    }
    TreeDFIterator<spvtools::opt::SENode>::operator++
              ((TreeDFIterator<spvtools::opt::SENode> *)local_80);
  } while( true );
}

Assistant:

SENode* ScalarEvolutionAnalysis::GetCoefficientFromRecurrentTerm(
    SENode* node, const Loop* loop) {
  // Traverse the DAG to find the recurrent expression belonging to |loop|.
  for (auto itr = node->graph_begin(); itr != node->graph_end(); ++itr) {
    SERecurrentNode* rec = itr->AsSERecurrentNode();
    if (rec && rec->GetLoop() == loop) {
      return rec->GetCoefficient();
    }
  }
  return CreateConstant(0);
}